

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_zhao_2010.h
# Opt level: O0

void __thiscall SBLA::SecondScan(SBLA *this)

{
  int iVar1;
  long lVar2;
  size_t *psVar3;
  uint uVar4;
  int local_20;
  int tmp;
  int pos;
  int i;
  int *img_labelsdata;
  SBLA *this_local;
  
  lVar2 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10;
  tmp = 0;
  do {
    if (this->M * this->N <= tmp) {
      if ((this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74 != '\0') {
        **(undefined1 **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x10 =
             (this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74;
        if ((this->N < 2) ||
           (*(char *)(*(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                                field_0x10 + 1) == '\0')) {
          if ((this->M < 2) ||
             (lVar2 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                                field_0x10,
             psVar3 = cv::MatStep::operator[]
                                ((MatStep *)
                                 &((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->
                                  field_0x48,0), *(char *)(lVar2 + *psVar3) == '\0')) {
            if (((this->N < 2) || (this->M < 2)) ||
               (lVar2 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                                  field_0x10,
               psVar3 = cv::MatStep::operator[]
                                  ((MatStep *)
                                   &((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->
                                    field_0x48,0), *(char *)(lVar2 + 1 + *psVar3) == '\0')) {
              **(undefined1 **)
                &((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10 = 1;
            }
            else {
              lVar2 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                                field_0x10;
              psVar3 = cv::MatStep::operator[]
                                 ((MatStep *)
                                  &((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->
                                   field_0x48,0);
              **(undefined1 **)
                &((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10 =
                   *(undefined1 *)(lVar2 + 1 + *psVar3);
            }
          }
          else {
            lVar2 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                              field_0x10;
            psVar3 = cv::MatStep::operator[]
                               ((MatStep *)
                                &((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->
                                 field_0x48,0);
            **(undefined1 **)
              &((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10 =
                 *(undefined1 *)(lVar2 + *psVar3);
          }
        }
        else {
          **(undefined1 **)
            &((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10 =
               *(undefined1 *)
                (*(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                           field_0x10 + 1);
        }
      }
      (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ =
           (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ + 1;
      return;
    }
    iVar1 = *(int *)(lVar2 + (long)tmp * 4);
    if (iVar1 < 0) {
      do {
        local_20 = iVar1;
        iVar1 = *(int *)(lVar2 + (long)-local_20 * 4);
        if (local_20 == iVar1) break;
      } while (iVar1 < 0);
      if (iVar1 < 0) {
        uVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ + 1;
        (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar4;
        *(uint *)(lVar2 + (long)-local_20 * 4) = uVar4;
      }
      *(undefined4 *)(lVar2 + (long)tmp * 4) = *(undefined4 *)(lVar2 + (long)-local_20 * 4);
    }
    tmp = tmp + 1;
  } while( true );
}

Assistant:

void SecondScan()
    {
        // Label assignment
        int *img_labelsdata = reinterpret_cast<int*>(img_labels_.data);
        for (int i = 0; i < M * N; ++i) {
            // FindRoot_GetLabel
            int pos = img_labelsdata[i];
            if (pos >= 0)
                continue;

            int tmp;
            while (true) {
                tmp = img_labelsdata[-pos];
                if (pos == tmp || tmp >= 0)
                    break;
                pos = tmp;
            }
            if (tmp < 0)
                img_labelsdata[-pos] = ++n_labels_;

            // Assign final label
            img_labelsdata[i] = img_labelsdata[-pos];
        }

        // Fix for first pixel!
        if (firstpixel) {
            const_cast<cv::Mat1b&>(img_).data[0] = firstpixel;
            if (N > 1 && img_labels_.data[1])
                img_labels_.data[0] = img_labels_.data[1];
            else if (M > 1 && img_labels_.data[img_.step[0]])
                img_labels_.data[0] = img_labels_.data[img_.step[0]];
            else if (N > 1 && M > 1 && img_labels_.data[img_.step[0] + 1])
                img_labels_.data[0] = img_labels_.data[img_.step[0] + 1];
            else
                img_labels_.data[0] = 1;
        }

        n_labels_++; // To count also background
    }